

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Triple.cpp
# Opt level: O2

void __thiscall llvm::Triple::setVendorName(Triple *this,StringRef Str)

{
  StringRef local_100;
  StringRef local_f0;
  StringRef local_e0;
  Twine local_d0;
  Twine local_b8;
  Twine local_a0;
  Twine local_88;
  Twine local_70;
  Twine local_58;
  Twine local_40;
  
  local_e0.Length = Str.Length;
  local_e0.Data = Str.Data;
  local_f0 = getArchName(this);
  Twine::Twine(&local_88,&local_f0,"-");
  Twine::Twine(&local_a0,&local_e0);
  Twine::concat(&local_70,&local_88,&local_a0);
  Twine::Twine(&local_b8,"-");
  Twine::concat(&local_58,&local_70,&local_b8);
  local_100 = getOSAndEnvironmentName(this);
  Twine::Twine(&local_d0,&local_100);
  Twine::concat(&local_40,&local_58,&local_d0);
  setTriple(this,&local_40);
  return;
}

Assistant:

void Triple::setVendorName(StringRef Str) {
  setTriple(getArchName() + "-" + Str + "-" + getOSAndEnvironmentName());
}